

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::main(void)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  long col;
  TPZVec<int> NumConnected;
  TPZVec<long> DestInd3;
  TPZVec<long> DestInd2;
  TPZVec<long> DestInd1;
  TPZFMatrix<double> KEl2;
  TPZFMatrix<double> KEl1;
  TPZFMatrix<double> KEl3;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> TestFront;
  
  TPZFMatrix<double>::TPZFMatrix(&KEl1,2,2);
  pdVar2 = TPZFMatrix<double>::operator()(&KEl1,0,0);
  *pdVar2 = 4.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl1,0,1);
  *pdVar2 = 6.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl1,1,0);
  *pdVar2 = 6.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl1,1,1);
  *pdVar2 = 12.0;
  TPZVec<long>::TPZVec(&DestInd1,2);
  *DestInd1.fStore = 0;
  DestInd1.fStore[1] = 1;
  TPZFMatrix<double>::TPZFMatrix(&KEl2,4,4);
  pdVar2 = TPZFMatrix<double>::operator()(&KEl2,0,0);
  *pdVar2 = 4.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl2,0,1);
  *pdVar2 = -6.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl2,0,2);
  *pdVar2 = 2.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl2,0,3);
  *pdVar2 = 6.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl2,1,1);
  *pdVar2 = 12.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl2,1,2);
  *pdVar2 = -6.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl2,1,3);
  *pdVar2 = -12.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl2,2,2);
  *pdVar2 = 4.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl2,2,3);
  *pdVar2 = 6.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl2,3,3);
  *pdVar2 = 12.0;
  for (lVar3 = 0; col = lVar3, lVar3 != 4; lVar3 = lVar3 + 1) {
    for (; col != 4; col = col + 1) {
      pdVar2 = TPZFMatrix<double>::operator()(&KEl2,lVar3,col);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()(&KEl2,col,lVar3);
      *pdVar2 = dVar1;
    }
  }
  TPZVec<long>::TPZVec(&DestInd2,4);
  *DestInd2.fStore = 0;
  DestInd2.fStore[1] = 1;
  DestInd2.fStore[2] = 2;
  DestInd2.fStore[3] = 3;
  TPZFMatrix<double>::TPZFMatrix(&KEl3,2,2);
  pdVar2 = TPZFMatrix<double>::operator()(&KEl3,0,0);
  *pdVar2 = 3.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl3,0,1);
  *pdVar2 = 3.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl1,1,0);
  *pdVar2 = 3.0;
  pdVar2 = TPZFMatrix<double>::operator()(&KEl3,1,1);
  *pdVar2 = 6.0;
  TPZVec<long>::TPZVec(&DestInd3,2);
  *DestInd3.fStore = 2;
  DestInd3.fStore[1] = 3;
  TPZFrontMatrix(&TestFront,4);
  TPZVec<int>::TPZVec(&NumConnected,4);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    NumConnected.fStore[lVar3] = 2;
  }
  SetNumElConnected(&TestFront,&NumConnected);
  SymbolicAddKel(&TestFront,&DestInd1);
  SymbolicAddKel(&TestFront,&DestInd2);
  SymbolicAddKel(&TestFront,&DestInd3);
  AllocData(&TestFront);
  SetNumElConnected(&TestFront,&NumConnected);
  AddKel(&TestFront,&KEl1,&DestInd1);
  AddKel(&TestFront,&KEl2,&DestInd2);
  AddKel(&TestFront,&KEl3,&DestInd3);
  TPZVec<int>::~TPZVec(&NumConnected);
  ~TPZFrontMatrix(&TestFront);
  TPZVec<long>::~TPZVec(&DestInd3);
  TPZFMatrix<double>::~TPZFMatrix(&KEl3);
  TPZVec<long>::~TPZVec(&DestInd2);
  TPZFMatrix<double>::~TPZFMatrix(&KEl2);
  TPZVec<long>::~TPZVec(&DestInd1);
  TPZFMatrix<double>::~TPZFMatrix(&KEl1);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}